

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

int test_destruction1(void)

{
  _Alloc_hider _Var1;
  int iVar2;
  T1_A *this;
  Context ctx;
  string local_78;
  Context local_58;
  
  destructionMark_abi_cxx11_._M_string_length = 0;
  *destructionMark_abi_cxx11_._M_dataplus._M_p = '\0';
  di::Context::Context(&local_58);
  this = di::Context::get<T1_A>(&local_58);
  T1_A::run_abi_cxx11_(&local_78,this);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  di::Context::~Context(&local_58);
  _Var1 = destructionMark_abi_cxx11_._M_dataplus;
  iVar2 = strcmp("ABC",destructionMark_abi_cxx11_._M_dataplus._M_p);
  if (iVar2 != 0) {
    printf("%s:%d expected \"%s\", actual: \"%s\"\n",
           "/workspace/llm4binary/github/license_all_cmakelists_25/hoditohod[P]di-light/test.cpp",
           0xde,"ABC",_Var1._M_p);
  }
  return (uint)(iVar2 == 0);
}

Assistant:

std::string run() { return "A"; }